

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.h
# Opt level: O0

InlineeFrameRecord *
InlineeFrameRecord::New
          (Allocator *alloc,uint argCount,uint constantCount,intptr_t functionBodyAddr,
          InlineeFrameInfo *frameInfo)

{
  Allocator *pAVar1;
  InlineeFrameRecord *this;
  Memory *pMVar2;
  IntType<(DataDesc)1> *pIVar3;
  VarType<(DataDesc)2> *pVVar4;
  TrackAllocData local_c8;
  code *local_a0;
  undefined8 local_98;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  InlineeFrameRecord *local_30;
  InlineeFrameRecord *record;
  InlineeFrameInfo *frameInfo_local;
  intptr_t functionBodyAddr_local;
  uint constantCount_local;
  uint argCount_local;
  Allocator *alloc_local;
  
  record = (InlineeFrameRecord *)frameInfo;
  frameInfo_local = (InlineeFrameInfo *)functionBodyAddr;
  functionBodyAddr_local._0_4_ = constantCount;
  functionBodyAddr_local._4_4_ = argCount;
  _constantCount_local = alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
             ,0x69);
  pAVar1 = NativeCodeData::Allocator::TrackAllocInfo(alloc,&local_58);
  local_68 = NativeCodeData::AllocatorT<InlineeFrameRecord>::AllocZero;
  local_60 = 0;
  this = (InlineeFrameRecord *)
         new<NativeCodeData::AllocatorT<InlineeFrameRecord>>
                   (0x58,(AllocatorT<InlineeFrameRecord> *)pAVar1,0x72bb40);
  InlineeFrameRecord(this,functionBodyAddr_local._4_4_,(FunctionBody *)frameInfo_local,
                     (InlineeFrameInfo *)record);
  pAVar1 = _constantCount_local;
  local_30 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&IntType<(DataDesc)1>::typeinfo,0,
             (ulong)functionBodyAddr_local._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
             ,0x6a);
  pMVar2 = (Memory *)NativeCodeData::Allocator::TrackAllocInfo(pAVar1,&local_90);
  local_a0 = NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<IntType<(DataDesc)1>_>_>::Alloc;
  local_98 = 0;
  pIVar3 = Memory::
           AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<IntType<(DataDesc)1>>>,IntType<(DataDesc)1>,false>
                     (pMVar2,(AllocatorNoFixup<NativeCodeData::Array<IntType<(DataDesc)1>_>_> *)
                             NativeCodeData::
                             AllocatorNoFixup<NativeCodeData::Array<IntType<(DataDesc)1>_>_>::Alloc,
                      0,(ulong)functionBodyAddr_local._4_4_);
  pAVar1 = _constantCount_local;
  local_30->argOffsets = &pIVar3->data;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_c8,(type_info *)&VarType<(DataDesc)2>::typeinfo,0,
             (ulong)(uint)functionBodyAddr_local,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
             ,0x6b);
  pMVar2 = (Memory *)NativeCodeData::Allocator::TrackAllocInfo(pAVar1,&local_c8);
  pVVar4 = Memory::
           AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<VarType<(DataDesc)2>>>,VarType<(DataDesc)2>,false>
                     (pMVar2,(AllocatorNoFixup<NativeCodeData::Array<VarType<(DataDesc)2>_>_> *)
                             NativeCodeData::
                             AllocatorNoFixup<NativeCodeData::Array<VarType<(DataDesc)2>_>_>::Alloc,
                      0,(ulong)(uint)functionBodyAddr_local);
  local_30->constants = &pVVar4->data;
  local_30->constantCount = (uint)functionBodyAddr_local;
  return local_30;
}

Assistant:

static InlineeFrameRecord* New(NativeCodeData::Allocator* alloc, uint argCount, uint constantCount, intptr_t functionBodyAddr, InlineeFrameInfo* frameInfo)
    {
        InlineeFrameRecord* record = NativeCodeDataNewZ(alloc, InlineeFrameRecord, argCount, (Js::FunctionBody*)functionBodyAddr, frameInfo);
        record->argOffsets = (int*)NativeCodeDataNewArrayNoFixup(alloc, IntType<DataDesc_InlineeFrameRecord_ArgOffsets>, argCount);
        record->constants = (Js::Var*)NativeCodeDataNewArrayNoFixup(alloc, VarType<DataDesc_InlineeFrameRecord_Constants>, constantCount);
        DebugOnly(record->constantCount = constantCount);
        return record;
    }